

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O0

_Bool PPC_abs_branch(cs_struct *h,uint id)

{
  int local_20;
  int i;
  uint id_local;
  cs_struct *h_local;
  
  local_20 = 0;
  while( true ) {
    if (insn_abs[local_20] == 0) {
      return false;
    }
    if (id == insn_abs[local_20]) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool PPC_abs_branch(cs_struct *h, unsigned int id)
{
	int i;

	for (i = 0; insn_abs[i]; i++) {
		if (id == insn_abs[i]) {
			return true;
		}
	}

	// not found
	return false;
}